

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

void BackwardReferences2DLocality(int xsize,VP8LBackwardRefs *refs)

{
  uint32_t uVar1;
  PixOrCopy *pPVar2;
  PixOrCopyBlock *pPVar3;
  PixOrCopy *pPVar4;
  
  pPVar3 = refs->refs;
  do {
    if (pPVar3 == (PixOrCopyBlock *)0x0) {
      pPVar4 = (PixOrCopy *)0x0;
      pPVar2 = (PixOrCopy *)0x0;
    }
    else {
      pPVar2 = pPVar3->start;
      pPVar4 = pPVar2 + pPVar3->size;
    }
    do {
      if (pPVar2 == (PixOrCopy *)0x0) {
        return;
      }
      if (pPVar2->mode == '\x02') {
        uVar1 = VP8LDistanceToPlaneCode(xsize,pPVar2->argb_or_distance);
        pPVar2->argb_or_distance = uVar1;
      }
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar4);
    pPVar3 = pPVar3->next;
  } while( true );
}

Assistant:

static void BackwardReferences2DLocality(int xsize,
                                         const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    if (PixOrCopyIsCopy(c.cur_pos)) {
      const int dist = c.cur_pos->argb_or_distance;
      const int transformed_dist = VP8LDistanceToPlaneCode(xsize, dist);
      c.cur_pos->argb_or_distance = transformed_dist;
    }
    VP8LRefsCursorNext(&c);
  }
}